

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::addMayerTerm
          (OptimalControlProblem *this,double weight,
          shared_ptr<iDynTree::optimalcontrol::LinearCost> *linearCost)

{
  OptimalControlProblemPimpl *pOVar1;
  bool bVar2;
  string *__x;
  double end;
  allocator<char> local_79;
  double local_78;
  double local_70;
  shared_ptr<iDynTree::optimalcontrol::Cost> local_68;
  string local_58;
  TimeRange newTimerange;
  
  local_78 = weight;
  local_70 = TimeRange::endTime(&this->m_pimpl->horizon);
  end = TimeRange::endTime(&this->m_pimpl->horizon);
  TimeRange::TimeRange(&newTimerange,local_70,end);
  pOVar1 = this->m_pimpl;
  std::__shared_ptr<iDynTree::optimalcontrol::Cost,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<iDynTree::optimalcontrol::LinearCost,void>
            ((__shared_ptr<iDynTree::optimalcontrol::Cost,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             &linearCost->
              super___shared_ptr<iDynTree::optimalcontrol::LinearCost,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"addMayerTerm",&local_79);
  bVar2 = OptimalControlProblemPimpl::addCost
                    (pOVar1,local_78,&newTimerange,&local_68,true,true,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.
              super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (bVar2) {
    pOVar1 = this->m_pimpl;
    __x = Cost::name_abi_cxx11_
                    ((Cost *)(linearCost->
                             super___shared_ptr<iDynTree::optimalcontrol::LinearCost,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pOVar1->mayerCostnames,__x);
  }
  return bVar2;
}

Assistant:

bool OptimalControlProblem::addMayerTerm(double weight, std::shared_ptr<LinearCost> linearCost)
        {
            TimeRange newTimerange(m_pimpl->horizon.endTime(), m_pimpl->horizon.endTime());
            if (!(m_pimpl->addCost(weight, newTimerange, linearCost, true, true, "addMayerTerm"))) {
                return false;
            }
            m_pimpl->mayerCostnames.push_back(linearCost->name());

            return true;
        }